

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Loader.c
# Opt level: O0

Library * CreateLibrary(char *file)

{
  uint64_t uVar1;
  Library *lib;
  char *file_local;
  
  file_local = (char *)malloc(0x20);
  if (file_local == (char *)0x0) {
    file_local = (char *)0x0;
  }
  else {
    *(char **)file_local = file;
    uVar1 = NFusage_worker(file,0);
    *(uint64_t *)(file_local + 8) = uVar1;
    file_local[0x10] = '\0';
    file_local[0x11] = '\0';
    file_local[0x12] = '\0';
    file_local[0x13] = '\0';
    file_local[0x14] = '\0';
    file_local[0x15] = '\0';
    file_local[0x16] = '\0';
    file_local[0x17] = '\0';
    file_local[0x18] = '\0';
    file_local[0x19] = '\0';
    file_local[0x1a] = '\0';
    file_local[0x1b] = '\0';
    file_local[0x1c] = '\0';
    file_local[0x1d] = '\0';
    file_local[0x1e] = '\0';
    file_local[0x1f] = '\0';
  }
  return (Library *)file_local;
}

Assistant:

Library *CreateLibrary(const char *file)
{
    Library *lib = malloc(sizeof(Library));
    if (!lib)
    {
        return NULL;
    }
    lib->file = file;
    lib->size = NFusage_worker(file, 0);
    lib->address = NULL;
    lib->internal = NULL;
    return lib;
}